

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

double __thiscall doctest::detail::MessageBuilder::log(MessageBuilder *this,double __x)

{
  Enum at;
  undefined8 *puVar1;
  IReporter **curr_rep;
  undefined8 *puVar2;
  double extraout_XMM0_Qa;
  String SStack_38;
  
  if (this->logged == false) {
    tlssPop();
    String::operator=((String *)this,&SStack_38);
    String::~String(&SStack_38);
    this->logged = true;
  }
  puVar1 = *(undefined8 **)(g_cs + 0x10d8);
  for (puVar2 = *(undefined8 **)(g_cs + 0x10d0); puVar2 != puVar1; puVar2 = puVar2 + 1) {
    (**(code **)(*(long *)*puVar2 + 0x50))((long *)*puVar2,this);
  }
  at = (this->super_MessageData).m_severity;
  if ((at & is_warn) == 0) {
    anon_unknown_14::addAssert(at);
    anon_unknown_14::addFailedAssert((this->super_MessageData).m_severity);
  }
  isDebuggerActive();
  return extraout_XMM0_Qa;
}

Assistant:

bool MessageBuilder::log() {
        if (!logged) {
            m_string = tlssPop();
            logged = true;
        }

        DOCTEST_ITERATE_THROUGH_REPORTERS(log_message, *this);

        const bool isWarn = m_severity & assertType::is_warn;

        // warn is just a message in this context so we don't treat it as an assert
        if(!isWarn) {
            addAssert(m_severity);
            addFailedAssert(m_severity);
        }

        return isDebuggerActive() && !getContextOptions()->no_breaks && !isWarn &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }